

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnMemory
          (BinaryReaderIR *this,Index index,Limits *page_limits,uint32_t page_size)

{
  Module *this_00;
  bool bVar1;
  pointer pMVar2;
  unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_> local_68;
  Memory *local_60;
  Memory *memory;
  undefined1 local_38 [8];
  __single_object field;
  uint32_t page_size_local;
  Limits *page_limits_local;
  Index index_local;
  BinaryReaderIR *this_local;
  
  field._M_t.
  super___uniq_ptr_impl<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>._M_t
  .super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>.
  super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl._4_4_ = page_size;
  GetLocation((Location *)&memory,this);
  std::make_unique<wabt::MemoryModuleField,wabt::Location>((Location *)local_38);
  pMVar2 = std::unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>::
           operator->((unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                       *)local_38);
  local_60 = &pMVar2->memory;
  (pMVar2->memory).page_limits.initial = page_limits->initial;
  (pMVar2->memory).page_limits.max = page_limits->max;
  bVar1 = page_limits->is_shared;
  (pMVar2->memory).page_limits.has_max = page_limits->has_max;
  (pMVar2->memory).page_limits.is_shared = bVar1;
  (pMVar2->memory).page_limits.is_64 = page_limits->is_64;
  (pMVar2->memory).page_size =
       field._M_t.
       super___uniq_ptr_impl<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
       ._M_t.
       super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
       .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl._4_4_;
  if (((pMVar2->memory).page_limits.is_shared & 1U) != 0) {
    (this->module_->features_used).threads = true;
  }
  this_00 = this->module_;
  std::unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>::
  unique_ptr(&local_68,
             (unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_> *)
             local_38);
  Module::AppendField(this_00,&local_68);
  std::unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>::
  ~unique_ptr(&local_68);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  std::unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>::
  ~unique_ptr((unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_> *)
              local_38);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnMemory(Index index,
                                const Limits* page_limits,
                                uint32_t page_size) {
  auto field = std::make_unique<MemoryModuleField>(GetLocation());
  Memory& memory = field->memory;
  memory.page_limits = *page_limits;
  memory.page_size = page_size;
  if (memory.page_limits.is_shared) {
    module_->features_used.threads = true;
  }
  module_->AppendField(std::move(field));
  return Result::Ok;
}